

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
llvm::SmallVectorTemplateBase<llvm::DILineInfo,_false>::grow
          (SmallVectorTemplateBase<llvm::DILineInfo,_false> *this,size_t MinSize)

{
  move_iterator<llvm::DILineInfo_*> __first;
  DILineInfo *S;
  SmallVectorTemplateBase<llvm::DILineInfo,_false> *__ptr;
  ulong uVar1;
  DILineInfo *__result;
  ulong uVar2;
  
  if (MinSize >> 0x20 != 0) {
    report_bad_alloc_error("SmallVector capacity overflow during allocation",true);
  }
  uVar1 = (ulong)(this->super_SmallVectorTemplateCommon<llvm::DILineInfo,_void>).
                 super_SmallVectorBase.Capacity + 2;
  uVar2 = uVar1 >> 1 | uVar1;
  uVar2 = uVar2 >> 2 | uVar2;
  uVar2 = uVar2 >> 4 | uVar2;
  uVar2 = uVar2 >> 8 | uVar2;
  uVar1 = (uVar1 >> 0x20 | uVar2 >> 0x10 | uVar2) + 1;
  if (uVar1 <= MinSize) {
    uVar1 = MinSize;
  }
  if (0xfffffffe < uVar1) {
    uVar1 = 0xffffffff;
  }
  __result = (DILineInfo *)malloc(uVar1 * 0x68);
  if (__result == (DILineInfo *)0x0) {
    report_bad_alloc_error("Allocation failed",true);
  }
  __first._M_current =
       (DILineInfo *)
       (this->super_SmallVectorTemplateCommon<llvm::DILineInfo,_void>).super_SmallVectorBase.BeginX;
  std::__uninitialized_copy<false>::
  __uninit_copy<std::move_iterator<llvm::DILineInfo*>,llvm::DILineInfo*>
            (__first,__first._M_current +
                     (this->super_SmallVectorTemplateCommon<llvm::DILineInfo,_void>).
                     super_SmallVectorBase.Size,__result);
  S = (DILineInfo *)
      (this->super_SmallVectorTemplateCommon<llvm::DILineInfo,_void>).super_SmallVectorBase.BeginX;
  destroy_range(S,S + (this->super_SmallVectorTemplateCommon<llvm::DILineInfo,_void>).
                      super_SmallVectorBase.Size);
  __ptr = (SmallVectorTemplateBase<llvm::DILineInfo,_false> *)
          (this->super_SmallVectorTemplateCommon<llvm::DILineInfo,_void>).super_SmallVectorBase.
          BeginX;
  if (__ptr != this + 1) {
    free(__ptr);
  }
  (this->super_SmallVectorTemplateCommon<llvm::DILineInfo,_void>).super_SmallVectorBase.BeginX =
       __result;
  (this->super_SmallVectorTemplateCommon<llvm::DILineInfo,_void>).super_SmallVectorBase.Capacity =
       (uint)uVar1;
  return;
}

Assistant:

void SmallVectorTemplateBase<T, TriviallyCopyable>::grow(size_t MinSize) {
  if (MinSize > UINT32_MAX)
    report_bad_alloc_error("SmallVector capacity overflow during allocation");

  // Always grow, even from zero.
  size_t NewCapacity = size_t(NextPowerOf2(this->capacity() + 2));
  NewCapacity = std::min(std::max(NewCapacity, MinSize), size_t(UINT32_MAX));
  T *NewElts = static_cast<T*>(llvm::safe_malloc(NewCapacity*sizeof(T)));

  // Move the elements over.
  this->uninitialized_move(this->begin(), this->end(), NewElts);

  // Destroy the original elements.
  destroy_range(this->begin(), this->end());

  // If this wasn't grown from the inline copy, deallocate the old space.
  if (!this->isSmall())
    free(this->begin());

  this->BeginX = NewElts;
  this->Capacity = NewCapacity;
}